

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O3

void P_NightmareRespawn(AActor *mobj)

{
  ushort uVar1;
  BYTE *pBVar2;
  double dVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  AActor *actor;
  undefined4 uVar6;
  undefined4 uVar7;
  double dVar8;
  DVector3 local_28;
  PClassActor *type;
  
  type = (PClassActor *)(mobj->super_DThinker).super_DObject.Class;
  if (type == (PClassActor *)0x0) {
    iVar5 = (**(mobj->super_DThinker).super_DObject._vptr_DObject)(mobj);
    type = (PClassActor *)CONCAT44(extraout_var,iVar5);
    (mobj->super_DThinker).super_DObject.Class = (PClass *)type;
  }
  pBVar2 = (type->super_PClass).Defaults;
  mobj->skillrespawncount = mobj->skillrespawncount + 1;
  if ((pBVar2[0x1bd] & 1) == 0) {
    if ((pBVar2[0x1c0] & 0x40) == 0) {
      dVar8 = -2147483648.0;
    }
    else {
      dVar8 = 2147483646.0;
    }
  }
  else {
    dVar8 = 2147483647.0;
  }
  local_28.X = (mobj->SpawnPoint).X;
  local_28.Y = (mobj->SpawnPoint).Y;
  local_28.Z = dVar8;
  actor = AActor::StaticSpawn(type,&local_28,NO_REPLACE,true);
  if ((dVar8 != -2147483648.0) || (NAN(dVar8))) {
    if ((dVar8 == 2147483647.0) && (!NAN(dVar8))) {
      (actor->__Pos).Z = (actor->__Pos).Z - (mobj->SpawnPoint).Z;
    }
    P_FindFloorCeiling(actor,0xe);
  }
  else {
    dVar3 = (mobj->SpawnPoint).Z + (actor->__Pos).Z;
    (actor->__Pos).Z = dVar3;
    dVar8 = actor->floorz;
    if (dVar3 < dVar8) {
      (actor->__Pos).Z = dVar8;
      dVar3 = dVar8;
    }
    if (actor->ceilingz < dVar3 + actor->Height) {
      (actor->__Pos).Z = actor->ceilingz - actor->Height;
    }
    P_FindFloorCeiling(actor,0xe);
    dVar8 = (actor->__Pos).Z;
    uVar6 = SUB84(dVar8,0);
    uVar7 = (undefined4)((ulong)dVar8 >> 0x20);
    dVar3 = actor->floorz;
    if (dVar8 < dVar3) {
      (actor->__Pos).Z = dVar3;
      uVar6 = SUB84(dVar3,0);
      uVar7 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    if (actor->ceilingz < (double)CONCAT44(uVar7,uVar6) + actor->Height) {
      (actor->__Pos).Z = actor->ceilingz - actor->Height;
    }
  }
  local_28.X = (actor->__Pos).X;
  local_28.Y = (actor->__Pos).Y;
  bVar4 = P_CheckPosition(actor,(DVector2 *)&local_28,true);
  if (bVar4) {
    dVar8 = (actor->__Pos).Z;
    (actor->SpawnPoint).Z = (mobj->SpawnPoint).Z;
    dVar3 = (mobj->SpawnPoint).Y;
    (actor->SpawnPoint).X = (mobj->SpawnPoint).X;
    (actor->SpawnPoint).Y = dVar3;
    uVar1 = mobj->SpawnAngle;
    actor->SpawnAngle = uVar1;
    actor->SpawnFlags = mobj->SpawnFlags & 0xffffffef;
    (actor->Angles).Yaw.Degrees = (double)uVar1;
    (*(actor->super_DThinker).super_DObject._vptr_DObject[0xb])(actor);
    actor->reactiontime = 0x12;
    AActor::CopyFriendliness(actor,mobj,false,true);
    actor->Translation = mobj->Translation;
    actor->skillrespawncount = mobj->skillrespawncount;
    (actor->Prev).Z = dVar8;
    local_28.X = (mobj->__Pos).X;
    local_28.Y = (mobj->__Pos).Y;
    local_28.Z = (mobj->__Pos).Z;
    P_SpawnTeleportFog(mobj,&local_28,true,true);
    local_28.X = (mobj->SpawnPoint).X;
    local_28.Y = (mobj->SpawnPoint).Y;
    local_28.Z = dVar8;
    P_SpawnTeleportFog(mobj,&local_28,false,true);
    actor = mobj;
  }
  else {
    AActor::ClearCounters(actor);
  }
  (*(actor->super_DThinker).super_DObject._vptr_DObject[4])(actor);
  return;
}

Assistant:

void P_NightmareRespawn (AActor *mobj)
{
	double z;
	AActor *mo;
	AActor *info = mobj->GetDefault();

	mobj->skillrespawncount++;

	// spawn the new monster (assume the spawn will be good)
	if (info->flags & MF_SPAWNCEILING)
		z = ONCEILINGZ;
	else if (info->flags2 & MF2_SPAWNFLOAT)
		z = FLOATRANDZ;
	else
		z = ONFLOORZ;

	// spawn it
	mo = AActor::StaticSpawn(mobj->GetClass(), DVector3(mobj->SpawnPoint.X, mobj->SpawnPoint.Y, z), NO_REPLACE, true);

	if (z == ONFLOORZ)
	{
		mo->AddZ(mobj->SpawnPoint.Z);
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{
			mo->SetZ(mo->ceilingz- mo->Height);
		}
	}
	else if (z == ONCEILINGZ)
	{
		mo->AddZ(-mobj->SpawnPoint.Z);
	}

	// If there are 3D floors, we need to find floor/ceiling again.
	P_FindFloorCeiling(mo, FFCF_SAMESECTOR | FFCF_ONLY3DFLOORS | FFCF_3DRESTRICT);

	if (z == ONFLOORZ)
	{
		if (mo->Z() < mo->floorz)
		{ // Do not respawn monsters in the floor, even if that's where they
		  // started. The initial P_ZMovement() call would have put them on
		  // the floor right away, but we need them on the floor now so we
		  // can use P_CheckPosition() properly.
			mo->SetZ(mo->floorz);
		}
		if (mo->Top() > mo->ceilingz)
		{ // Do the same for the ceiling.
			mo->SetZ(mo->ceilingz - mo->Height);
		}
	}

	// something is occupying its position?
	if (!P_CheckPosition(mo, mo->Pos(), true))
	{
		//[GrafZahl] MF_COUNTKILL still needs to be checked here.
		mo->ClearCounters();
		mo->Destroy ();
		return;		// no respawn
	}

	z = mo->Z();

	// inherit attributes from deceased one
	mo->SpawnPoint = mobj->SpawnPoint;
	mo->SpawnAngle = mobj->SpawnAngle;
	mo->SpawnFlags = mobj->SpawnFlags & ~MTF_DORMANT;	// It wasn't dormant when it died, so it's not dormant now, either.
	mo->Angles.Yaw = (double)mobj->SpawnAngle;

	mo->HandleSpawnFlags ();
	mo->reactiontime = 18;
	mo->CopyFriendliness (mobj, false);
	mo->Translation = mobj->Translation;

	mo->skillrespawncount = mobj->skillrespawncount;

	mo->Prev.Z = z;		// Do not interpolate Z position if we changed it since spawning.

	// spawn a teleport fog at old spot because of removal of the body?
	P_SpawnTeleportFog(mobj, mobj->Pos(), true, true);

	// spawn a teleport fog at the new spot
	P_SpawnTeleportFog(mobj, DVector3(mobj->SpawnPoint, z), false, true);

	// remove the old monster
	mobj->Destroy ();
}